

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O1

int cgltf_parse_json_nodes
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_data *out_data)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint i_00;
  int iVar5;
  int iVar6;
  cgltf_extension *__s;
  int iVar7;
  cgltf_float *out_array;
  int iVar8;
  ulong uVar9;
  cgltf_size cVar10;
  cgltf_node *out_string;
  cgltf_size cVar11;
  jsmntok_t *pjVar12;
  bool bVar13;
  int iVar14;
  cgltf_size *out_array_00;
  cgltf_size *in_stack_ffffffffffffff28;
  uint local_bc;
  
  out_array_00 = &out_data->nodes_count;
  uVar3 = cgltf_parse_json_array
                    (options,tokens,i,(uint8_t *)0xf0,(size_t)&out_data->nodes,(void **)out_array_00
                     ,in_stack_ffffffffffffff28);
  if ((-1 < (int)uVar3) && (*out_array_00 != 0)) {
    uVar9 = 0;
    do {
      if (tokens[uVar3].type == JSMN_OBJECT) {
        out_string = out_data->nodes + uVar9;
        *(undefined8 *)(out_string->rotation + 3) = 0x3f8000003f800000;
        out_string->scale[1] = 1.0;
        out_string->scale[2] = 1.0;
        out_string->matrix[0] = 1.0;
        out_string->matrix[5] = 1.0;
        out_string->matrix[10] = 1.0;
        out_string->matrix[0xf] = 1.0;
        iVar1 = tokens[uVar3].size;
        uVar3 = uVar3 + 1;
        if (0 < iVar1) {
          iVar8 = 0;
          do {
            if ((tokens[uVar3].type != JSMN_STRING) ||
               (pjVar12 = tokens + uVar3, pjVar12->size == 0)) goto LAB_001130a9;
            iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"name");
            if (iVar4 == 0) {
              i_00 = cgltf_parse_json_string(options,tokens,uVar3 + 1,json_chunk,&out_string->name);
            }
            else {
              iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"children");
              if (iVar4 == 0) {
                uVar3 = cgltf_parse_json_array
                                  (options,tokens,uVar3 + 1,(uint8_t *)0x8,
                                   (size_t)&out_string->children,
                                   (void **)&out_string->children_count,in_stack_ffffffffffffff28);
                if ((int)uVar3 < 0) break;
                cVar11 = out_string->children_count;
                i_00 = uVar3;
                if (cVar11 != 0) {
                  pjVar12 = tokens + uVar3;
                  cVar10 = 0;
                  do {
                    iVar4 = cgltf_json_to_int(pjVar12,json_chunk);
                    out_string->children[cVar10] = (cgltf_node *)((long)iVar4 + 1);
                    cVar10 = cVar10 + 1;
                    pjVar12 = pjVar12 + 1;
                  } while (cVar11 != cVar10);
                  i_00 = uVar3 + (int)cVar10;
                }
              }
              else {
                iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"mesh");
                if (iVar4 == 0) {
                  if (tokens[(long)(int)uVar3 + 1].type != JSMN_PRIMITIVE) goto LAB_001130a9;
                  iVar4 = cgltf_json_to_int(tokens + (long)(int)uVar3 + 1,json_chunk);
                  out_string->mesh = (cgltf_mesh *)((long)iVar4 + 1);
                  out_string->mesh_index = iVar4;
                }
                else {
                  iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"skin");
                  if (iVar4 != 0) {
                    iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"camera");
                    if (iVar4 == 0) {
                      if (tokens[(long)(int)uVar3 + 1].type == JSMN_PRIMITIVE) {
                        iVar4 = cgltf_json_to_int(tokens + (long)(int)uVar3 + 1,json_chunk);
                        out_string->camera = (cgltf_camera *)((long)iVar4 + 1);
                        i_00 = uVar3 + 2;
                        goto LAB_00112bda;
                      }
                      goto LAB_001130a9;
                    }
                    iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"translation");
                    if (iVar4 == 0) {
                      out_string->has_translation = 1;
                      out_array = out_string->translation;
LAB_00112c92:
                      iVar7 = uVar3 + 1;
                      iVar4 = 3;
                    }
                    else {
                      iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"rotation");
                      if (iVar4 == 0) {
                        out_string->has_rotation = 1;
                        iVar7 = uVar3 + 1;
                        iVar4 = 4;
                        out_array = out_string->rotation;
                      }
                      else {
                        iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"scale");
                        if (iVar4 == 0) {
                          out_string->has_scale = 1;
                          out_array = out_string->scale;
                          goto LAB_00112c92;
                        }
                        iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"matrix");
                        if (iVar4 == 0) {
                          out_string->has_matrix = 1;
                          iVar7 = uVar3 + 1;
                          iVar4 = 0x10;
                          out_array = out_string->matrix;
                        }
                        else {
                          iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"weights");
                          if (iVar4 != 0) {
                            iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"extras");
                            if (iVar4 == 0) {
                              (out_string->extras).start_offset = (long)tokens[uVar3 + 1].start;
                              (out_string->extras).end_offset = (long)tokens[uVar3 + 1].end;
                            }
                            else {
                              iVar4 = cgltf_json_strcmp(pjVar12,json_chunk,"extensions");
                              i_00 = uVar3 + 1;
                              if (iVar4 == 0) {
                                if ((tokens[i_00].type != JSMN_OBJECT) ||
                                   (out_string->extensions != (cgltf_extension *)0x0))
                                goto LAB_001130a9;
                                iVar4 = tokens[i_00].size;
                                out_string->extensions_count = 0;
                                if ((long)iVar4 < 0) {
                                  __s = (cgltf_extension *)0x0;
                                }
                                else {
                                  cVar11 = (long)iVar4 << 4;
                                  __s = (cgltf_extension *)
                                        (*(options->memory).alloc)
                                                  ((options->memory).user_data,cVar11);
                                  if (__s == (cgltf_extension *)0x0) {
                                    __s = (cgltf_extension *)0x0;
                                  }
                                  else {
                                    memset(__s,0,cVar11);
                                  }
                                }
                                out_string->extensions = __s;
                                if (__s == (cgltf_extension *)0x0) {
                                  bVar2 = false;
                                  uVar3 = 0xfffffffe;
                                }
                                else {
                                  i_00 = uVar3 + 2;
                                  if (iVar4 < 1) {
                                    bVar2 = true;
                                    uVar3 = local_bc;
                                  }
                                  else {
                                    iVar7 = 0;
                                    do {
                                      uVar3 = 0xffffffff;
                                      if (tokens[i_00].type != JSMN_STRING) {
                                        bVar2 = true;
                                        goto LAB_0011308f;
                                      }
                                      uVar3 = i_00;
                                      if (tokens[i_00].size == 0) {
LAB_0011308a:
                                        i_00 = uVar3;
                                        bVar2 = true;
                                        uVar3 = 0xffffffff;
                                        goto LAB_0011308f;
                                      }
                                      iVar5 = cgltf_json_strcmp(tokens + i_00,json_chunk,
                                                                "KHR_lights_punctual");
                                      if (iVar5 == 0) {
                                        uVar3 = i_00 + 1;
                                        if (tokens[uVar3].type != JSMN_OBJECT) goto LAB_0011308a;
                                        iVar5 = tokens[uVar3].size;
                                        i_00 = i_00 + 2;
                                        bVar13 = 0 < iVar5;
                                        if (iVar5 < 1) {
                                          bVar2 = false;
                                        }
                                        else if (tokens[i_00].type == JSMN_STRING) {
                                          pjVar12 = tokens + i_00;
                                          if (pjVar12->size != 0) {
                                            bVar2 = false;
                                            iVar14 = 1;
                                            do {
                                              iVar6 = cgltf_json_strcmp(pjVar12,json_chunk,"light");
                                              uVar3 = i_00 + 1;
                                              if (iVar6 == 0) {
                                                if (tokens[uVar3].type != JSMN_PRIMITIVE) {
                                                  bVar2 = true;
                                                  local_bc = 0xffffffff;
                                                  i_00 = uVar3;
                                                  goto LAB_00112ff1;
                                                }
                                                iVar6 = cgltf_json_to_int(tokens + uVar3,json_chunk)
                                                ;
                                                out_string->light = (cgltf_light *)((long)iVar6 + 1)
                                                ;
                                                i_00 = i_00 + 2;
                                              }
                                              else {
                                                i_00 = cgltf_skip_json(tokens,uVar3);
                                              }
                                              if ((int)i_00 < 0) {
                                                bVar2 = true;
                                                local_bc = i_00;
                                                goto LAB_00112ff1;
                                              }
                                              bVar13 = iVar14 < iVar5;
                                              if (iVar14 == iVar5) goto LAB_00112ff1;
                                              if (tokens[i_00].type != JSMN_STRING) break;
                                              pjVar12 = tokens + i_00;
                                              iVar14 = iVar14 + 1;
                                            } while (pjVar12->size != 0);
                                          }
                                          bVar2 = true;
                                          local_bc = 0xffffffff;
                                        }
                                        else {
                                          bVar2 = true;
                                          local_bc = 0xffffffff;
                                        }
LAB_00112ff1:
                                        uVar3 = local_bc;
                                        if (bVar13) goto LAB_0011308f;
                                      }
                                      else {
                                        cVar11 = out_string->extensions_count;
                                        out_string->extensions_count = cVar11 + 1;
                                        i_00 = cgltf_parse_json_unprocessed_extension
                                                         (options,tokens,i_00,json_chunk,
                                                          out_string->extensions + cVar11);
                                      }
                                      if ((int)i_00 < 0) {
                                        bVar2 = true;
                                        uVar3 = i_00;
                                        goto LAB_0011308f;
                                      }
                                      iVar7 = iVar7 + 1;
                                    } while (iVar7 != iVar4);
                                    bVar2 = false;
                                    uVar3 = local_bc;
LAB_0011308f:
                                    bVar2 = !bVar2;
                                  }
                                }
                                local_bc = uVar3;
                                if (bVar2) goto LAB_00112bda;
                                break;
                              }
                            }
                            i_00 = cgltf_skip_json(tokens,uVar3 + 1);
                            goto LAB_00112bda;
                          }
                          uVar3 = cgltf_parse_json_array
                                            (options,tokens,uVar3 + 1,(uint8_t *)0x4,
                                             (size_t)&out_string->weights,
                                             (void **)&out_string->weights_count,
                                             in_stack_ffffffffffffff28);
                          if ((int)uVar3 < 0) break;
                          iVar7 = uVar3 - 1;
                          iVar4 = (int)out_string->weights_count;
                          out_array = out_string->weights;
                        }
                      }
                    }
                    i_00 = cgltf_parse_json_float_array(tokens,iVar7,json_chunk,out_array,iVar4);
                    goto LAB_00112bda;
                  }
                  if (tokens[(long)(int)uVar3 + 1].type != JSMN_PRIMITIVE) goto LAB_001130a9;
                  iVar4 = cgltf_json_to_int(tokens + (long)(int)uVar3 + 1,json_chunk);
                  out_string->skin = (cgltf_skin *)((long)iVar4 + 1);
                }
                i_00 = uVar3 + 2;
              }
            }
LAB_00112bda:
            uVar3 = i_00;
            if (((int)uVar3 < 0) || (iVar8 = iVar8 + 1, iVar8 == iVar1)) break;
          } while( true );
        }
      }
      else {
LAB_001130a9:
        uVar3 = 0xffffffff;
      }
    } while ((-1 < (int)uVar3) && (uVar9 = uVar9 + 1, uVar9 < *out_array_00));
  }
  return uVar3;
}

Assistant:

static int cgltf_parse_json_nodes(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_data* out_data)
{
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(cgltf_node), (void**)&out_data->nodes, &out_data->nodes_count);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < out_data->nodes_count; ++j)
	{
		i = cgltf_parse_json_node(options, tokens, i, json_chunk, &out_data->nodes[j]);
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}